

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str-util.cc
# Opt level: O0

string * tinyusdz::unescapeBackslash(string *__return_storage_ptr__,string *str)

{
  ulong uVar1;
  string *psVar2;
  size_type pos;
  string local_68 [8];
  string bs_unescaped;
  string local_40 [8];
  string bs;
  string *str_local;
  string *s;
  
  bs.field_2._M_local_buf[0xf] = '\0';
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            (local_40,"\\\\",(allocator *)(bs_unescaped.field_2._M_local_buf + 0xf));
  ::std::allocator<char>::~allocator((allocator<char> *)(bs_unescaped.field_2._M_local_buf + 0xf));
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_68,"\\",(allocator *)((long)&pos + 7));
  ::std::allocator<char>::~allocator((allocator<char> *)((long)&pos + 7));
  while( true ) {
    uVar1 = ::std::__cxx11::string::find((string *)__return_storage_ptr__,(ulong)local_40);
    if (uVar1 == 0xffffffffffffffff) break;
    psVar2 = (string *)::std::__cxx11::string::length();
    ::std::__cxx11::string::replace((ulong)__return_storage_ptr__,uVar1,psVar2);
    ::std::__cxx11::string::length();
  }
  bs.field_2._M_local_buf[0xf] = '\x01';
  ::std::__cxx11::string::~string(local_68);
  ::std::__cxx11::string::~string(local_40);
  if ((bs.field_2._M_local_buf[0xf] & 1U) == 0) {
    ::std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string unescapeBackslash(const std::string &str) {
  std::string s = str;

  std::string bs = "\\\\";
  std::string bs_unescaped = "\\";

  std::string::size_type pos = 0;
  while ((pos = s.find(bs, pos)) != std::string::npos) {
    s.replace(pos, bs.length(), bs_unescaped);
    pos += bs_unescaped.length();
  }

  return s;
}